

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

string * __thiscall
pfederc::NumberToken::toString_abi_cxx11_
          (string *__return_storage_ptr__,NumberToken *this,Lexer *lexer)

{
  int8_t iVar1;
  byte bVar2;
  TokenType TVar3;
  int16_t iVar4;
  uint16_t uVar5;
  int32_t __val;
  uint32_t __val_00;
  int64_t __val_01;
  uint64_t __val_02;
  float __val_03;
  double __val_04;
  allocator<char> local_162;
  allocator<char> local_161;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  Lexer *local_20;
  Lexer *lexer_local;
  NumberToken *this_local;
  
  local_20 = lexer;
  lexer_local = (Lexer *)this;
  this_local = (NumberToken *)__return_storage_ptr__;
  TVar3 = Token::getType(&this->super_Token);
  switch(TVar3) {
  case TOK_INT8:
    iVar1 = i8(this);
    std::__cxx11::to_string(&local_40,(int)iVar1);
    std::operator+(__return_storage_ptr__,&local_40,'s');
    std::__cxx11::string::~string((string *)&local_40);
    break;
  case TOK_INT16:
    iVar4 = i16(this);
    std::__cxx11::to_string(&local_60,(int)iVar4);
    std::operator+(__return_storage_ptr__,&local_60,'S');
    std::__cxx11::string::~string((string *)&local_60);
    break;
  case TOK_INT32:
    __val = i32(this);
    std::__cxx11::to_string(__return_storage_ptr__,__val);
    break;
  case TOK_INT64:
    __val_01 = i64(this);
    std::__cxx11::to_string(&local_80,__val_01);
    std::operator+(__return_storage_ptr__,&local_80,'L');
    std::__cxx11::string::~string((string *)&local_80);
    break;
  case TOK_UINT8:
    bVar2 = u8(this);
    std::__cxx11::to_string(&local_a0,(uint)bVar2);
    std::operator+(__return_storage_ptr__,&local_a0,"us");
    std::__cxx11::string::~string((string *)&local_a0);
    break;
  case TOK_UINT16:
    uVar5 = u16(this);
    std::__cxx11::to_string(&local_c0,(uint)uVar5);
    std::operator+(__return_storage_ptr__,&local_c0,"uS");
    std::__cxx11::string::~string((string *)&local_c0);
    break;
  case TOK_UINT32:
    __val_00 = u32(this);
    std::__cxx11::to_string(&local_e0,__val_00);
    std::operator+(__return_storage_ptr__,&local_e0,'u');
    std::__cxx11::string::~string((string *)&local_e0);
    break;
  case TOK_UINT64:
    __val_02 = u64(this);
    std::__cxx11::to_string(&local_100,__val_02);
    std::operator+(__return_storage_ptr__,&local_100,"uL");
    std::__cxx11::string::~string((string *)&local_100);
    break;
  case TOK_FLT32:
    __val_03 = f32(this);
    std::__cxx11::to_string(&local_120,__val_03);
    std::operator+(__return_storage_ptr__,&local_120,'f');
    std::__cxx11::string::~string((string *)&local_120);
    break;
  case TOK_FLT64:
    __val_04 = f64(this);
    std::__cxx11::to_string(&local_140,__val_04);
    std::operator+(__return_storage_ptr__,&local_140,'F');
    std::__cxx11::string::~string((string *)&local_140);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"Unexpected number token type",&local_161);
    fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_lexer/src/token.cpp"
          ,0x17e,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_162);
    std::allocator<char>::~allocator(&local_162);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NumberToken::toString(const Lexer &lexer) const noexcept {
  switch(getType()) {
  case TokenType::TOK_INT8:
    return std::to_string(i8()) + 's';
  case TokenType::TOK_INT16:
    return std::to_string(i16()) + 'S';
  case TokenType::TOK_INT32:
    return std::to_string(i32());
  case TokenType::TOK_INT64:
    return std::to_string(i64()) + 'L';
  case TokenType::TOK_UINT8:
    return std::to_string(u8()) + "us";
  case TokenType::TOK_UINT16:
    return std::to_string(u16()) + "uS";
  case TokenType::TOK_UINT32:
    return std::to_string(u32()) + 'u';
  case TokenType::TOK_UINT64:
    return std::to_string(u64()) + "uL";
  case TokenType::TOK_FLT32:
    return std::to_string(f32()) + 'f';
  case TokenType::TOK_FLT64:
    return std::to_string(f64()) + 'F';
  default:
    fatal(__FILE__, __LINE__, "Unexpected number token type");
    return "";
  }
}